

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

void s3clr_fattr(void)

{
  long lVar1;
  char *__ptr;
  int32 *piVar2;
  char **ppcVar3;
  
  if (attrib[0] == (char *)0x0) {
    lVar1 = 0;
  }
  else {
    piVar2 = alloc;
    ppcVar3 = value;
    lVar1 = 0;
    __ptr = attrib[0];
    do {
      if (*piVar2 != 0) {
        free(__ptr);
        if (*ppcVar3 != (char *)0x0) {
          free(*ppcVar3);
        }
        *piVar2 = 0;
      }
      __ptr = attrib[lVar1 + 1];
      lVar1 = lVar1 + 1;
      piVar2 = piVar2 + 1;
      ppcVar3 = ppcVar3 + 1;
    } while (__ptr != (char *)0x0);
  }
  if ((int)lVar1 != n_attrib) {
    __assert_fail("i == n_attrib",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/s3io.c"
                  ,0x52,"void s3clr_fattr()");
  }
  n_attrib = 0;
  value[0] = (char *)0x0;
  attrib[0] = (char *)0x0;
  return;
}

Assistant:

void s3clr_fattr()
{
    int i;

    for (i = 0; attrib[i]; i++) {
	if (alloc[i]) {
	    if (attrib[i]) {
		free(attrib[i]);
	    }
	    if (value[i]) {
		free(value[i]);
	    }	    
	    alloc[i] = FALSE;
	}
    }
    assert(i == n_attrib);
    n_attrib = 0;
    attrib[0] = value[0] = NULL;
}